

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError AlsaOpen(PaUtilHostApiRepresentation *hostApi,PaStreamParameters *params,
                StreamDirection streamDir,snd_pcm_t **pcm)

{
  int iVar1;
  int iVar2;
  PaAlsaDeviceInfo *pPVar3;
  pthread_t pVar4;
  char *pcVar5;
  int __pa_unsure_error_id_1;
  int __pa_unsure_error_id;
  PaAlsaStreamInfo *streamInfo;
  PaAlsaDeviceInfo *deviceInfo;
  char *deviceName;
  int ret;
  PaError result;
  snd_pcm_t **pcm_local;
  StreamDirection streamDir_local;
  PaStreamParameters *params_local;
  PaUtilHostApiRepresentation *hostApi_local;
  
  deviceName._4_4_ = 0;
  if (params->hostApiSpecificStreamInfo == (void *)0x0) {
    pPVar3 = GetDeviceInfo(hostApi,params->device);
    deviceInfo = (PaAlsaDeviceInfo *)pPVar3->alsaName;
  }
  else {
    deviceInfo = *(PaAlsaDeviceInfo **)((long)params->hostApiSpecificStreamInfo + 0x18);
  }
  iVar1 = OpenPcm(pcm,(char *)deviceInfo,(uint)(streamDir == StreamDirection_In),1,1);
  if ((iVar1 < 0) && (*pcm = (snd_pcm_t *)0x0, iVar1 < 0)) {
    iVar2 = -0x2709;
    if (iVar1 == -0x10) {
      iVar2 = -0x2701;
    }
    if (iVar2 == -9999) {
      pVar4 = pthread_self();
      iVar2 = pthread_equal(pVar4,paUnixMainThread);
      if (iVar2 != 0) {
        pcVar5 = (*alsa_snd_strerror)(iVar1);
        PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar5);
      }
    }
    PaUtil_DebugPrint(
                     "Expression \'ret\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1735\n"
                     );
    deviceName._4_4_ = -0x2709;
    if (iVar1 == -0x10) {
      deviceName._4_4_ = -0x2701;
    }
  }
  else {
    iVar1 = (*(code *)alsa_snd_pcm_nonblock)(*pcm,0);
    if (iVar1 < 0) {
      pVar4 = pthread_self();
      iVar2 = pthread_equal(pVar4,paUnixMainThread);
      if (iVar2 != 0) {
        pcVar5 = (*alsa_snd_strerror)(iVar1);
        PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar5);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_nonblock( *pcm, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1737\n"
                       );
      deviceName._4_4_ = -9999;
    }
  }
  return deviceName._4_4_;
}

Assistant:

static PaError AlsaOpen( const PaUtilHostApiRepresentation *hostApi, const PaStreamParameters *params, StreamDirection
        streamDir, snd_pcm_t **pcm )
{
    PaError result = paNoError;
    int ret;
    const char* deviceName = "";
    const PaAlsaDeviceInfo *deviceInfo = NULL;
    PaAlsaStreamInfo *streamInfo = (PaAlsaStreamInfo *)params->hostApiSpecificStreamInfo;

    if( !streamInfo )
    {
        deviceInfo = GetDeviceInfo( hostApi, params->device );
        deviceName = deviceInfo->alsaName;
    }
    else
        deviceName = streamInfo->deviceString;

    PA_DEBUG(( "%s: Opening device %s\n", __FUNCTION__, deviceName ));
    if( (ret = OpenPcm( pcm, deviceName, streamDir == StreamDirection_In ? SND_PCM_STREAM_CAPTURE : SND_PCM_STREAM_PLAYBACK,
                    SND_PCM_NONBLOCK, 1 )) < 0 )
    {
        /* Not to be closed */
        *pcm = NULL;
        ENSURE_( ret, -EBUSY == ret ? paDeviceUnavailable : paBadIODeviceCombination );
    }
    ENSURE_( alsa_snd_pcm_nonblock( *pcm, 0 ), paUnanticipatedHostError );

end:
    return result;

error:
    goto end;
}